

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O3

Image * MakeLightImage(Image *__return_storage_ptr__,Point2i res)

{
  undefined4 uVar1;
  Allocator alloc;
  Image *extraout_RAX;
  Image *extraout_RAX_00;
  Image *pIVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long *plVar7;
  ulong uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> values;
  int local_c0;
  ulong local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [2];
  ColorEncodingHandle local_38;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"R","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"G","");
  plVar7 = local_48;
  local_58[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"B","");
  local_38.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 3;
  channels.ptr = &local_98;
  pbrt::Image::Image(__return_storage_ptr__,Float,res,channels,&local_38,alloc);
  lVar5 = -0x60;
  pIVar2 = extraout_RAX;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
      pIVar2 = extraout_RAX_00;
    }
    plVar7 = plVar7 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  local_c0 = res.super_Tuple2<pbrt::Point2,_int>.y;
  if (0 < local_c0) {
    uVar3 = res.super_Tuple2<pbrt::Point2,_int>.x;
    iVar6 = 0;
    lVar5 = 0;
    local_b8 = 0;
    do {
      if (0 < (int)uVar3) {
        iVar4 = 0;
        uVar8 = 0;
        do {
          uVar1 = 0;
          if ((400 < uVar8 || (int)uVar8 - 0x1eU < 0xab) && (int)local_b8 - 0x28U < 0xb5) {
            fVar9 = sinf((float)iVar4 / (float)(int)(local_c0 * uVar3));
            auVar10._0_4_ = (float)((double)fVar9 + 0.2);
            auVar10._4_4_ = (int)((ulong)((double)fVar9 + 0.2) >> 0x20);
            auVar10._8_8_ = 0;
            auVar10 = vmaxss_avx(auVar10,ZEXT416(0));
            uVar1 = auVar10._0_4_;
          }
          local_98._M_string_length._0_4_ = uVar1;
          local_98._M_dataplus._M_p._4_4_ = (undefined4)local_98._M_string_length;
          local_98._M_dataplus._M_p._0_4_ = (undefined4)local_98._M_string_length;
          values.n = 3;
          values.ptr = (float *)&local_98;
          pbrt::Image::SetChannels(__return_storage_ptr__,(Point2i)(lVar5 + uVar8),values);
          uVar8 = uVar8 + 1;
          iVar4 = iVar4 + iVar6;
        } while ((uVar3 & 0x7fffffff) != uVar8);
      }
      pIVar2 = (Image *)0x100000000;
      iVar6 = iVar6 + 100;
      lVar5 = lVar5 + 0x100000000;
      local_b8 = local_b8 + 1;
    } while (local_b8 != (ulong)res.super_Tuple2<pbrt::Point2,_int> >> 0x20);
  }
  return pIVar2;
}

Assistant:

static Image MakeLightImage(Point2i res) {
    Image image(PixelFormat::Float, res, {"R", "G", "B"});
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x) {
            Float val = 0;
            if (((x >= 30 && x <= 200) || x > 400) && y >= 40 && y <= 220) {
                val = .2 + std::sin(100 * x * y / Float(res[0] * res[1]));
                val = std::max(Float(0), val);
            }
            image.SetChannels({x, y}, {val, val, val});
        }
    return image;
}